

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XMLReader::getUpToCharOrWS(XMLReader *this,XMLBuffer *toFill,XMLCh toCheck)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  XMLCh toAppend;
  undefined8 in_RAX;
  XMLCh curCh;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    while( true ) {
      uVar1 = this->fCharIndex;
      uVar2 = this->fCharsAvail;
      if (uVar2 <= uVar1) break;
      toAppend = this->fCharBuf[uVar1];
      uStack_38 = CONCAT26(toAppend,(undefined6)uStack_38);
      if ((toAppend == toCheck) || ((char)this->fgCharCharsTable[(ushort)toAppend] < '\0'))
      goto LAB_002bf864;
      this->fCharIndex = uVar1 + 1;
      if ((toAppend & 0xdf52U) == 0) {
        handleEOL(this,(XMLCh *)((long)&uStack_38 + 6),false);
        toAppend = uStack_38._6_2_;
      }
      else {
        this->fCurCol = this->fCurCol + 1;
      }
      XMLBuffer::append(toFill,toAppend);
    }
    bVar3 = refreshCharBuffer(this);
  } while (bVar3);
LAB_002bf864:
  return uVar1 < uVar2;
}

Assistant:

bool XMLReader::getUpToCharOrWS(XMLBuffer& toFill, const XMLCh toCheck)
{
    while (true)
    {
        // Loop through the current chars in the buffer
        while (fCharIndex < fCharsAvail)
        {
            // Get the current char out of the buffer
            XMLCh curCh = fCharBuf[fCharIndex];

            //
            //  See if its not a white space or our target char, then process
            //  it. Else, we need to return.
            //
            if (!isWhitespace(curCh) && (curCh != toCheck))
            {
                // Eat this char
                fCharIndex++;

                //
                //  'curCh' is not a whitespace(x20|x9|xD|xA), so we only can
                //  have end-of-line combinations with a leading chNEL(x85) or
                //  chLineSeparator(x2028)
                //
                //  0010000000101000 chLineSeparator
                //  0000000010000101 chNEL
                //  ---------------------
                //  1101111101010010 == ~(chNEL|chLineSeparator)
                //
                //  if the result of the logical-& operation is
                //  true  : 'curCh' can not be chNEL or chLineSeparator
                //  false : 'curCh' can be chNEL or chLineSeparator
                //
                if ( curCh & (XMLCh) ~(chNEL|chLineSeparator) )
                {
                    fCurCol++;
                } else
                {
                    handleEOL(curCh, false);
                }

                // Add it to our buffer
                toFill.append(curCh);
            }
             else
            {
                return true;
            }
        }

        //
        //  We've eaten up the current buffer, so lets try to reload it. If
        //  we don't get anything new, then break out. If we do, then we go
        //  back to the top to keep getting spaces.
        //
        if (!refreshCharBuffer())
            break;
    }

    // We never hit any non-space and ate up the whole reader
    return false;

}